

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

Identification * __thiscall
ASDCP::MXF::Identification::InitFromTLVSet(Identification *this,TLVReader *TLVSet)

{
  bool has_value;
  int iVar1;
  MDDEntry *pMVar2;
  MDDEntry *pMVar3;
  MDDEntry *in_RDX;
  TLVReader local_3e0;
  TLVReader local_378;
  TLVReader local_310;
  TLVReader local_2a8;
  TLVReader local_240;
  TLVReader local_1d8;
  TLVReader local_170;
  TLVReader local_108;
  TLVReader local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVReader *TLVSet_local;
  Identification *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOReader.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0xb3,
                  "virtual ASDCP::Result_t ASDCP::MXF::Identification::InitFromTLVSet(TLVReader &)")
    ;
  }
  local_21 = 0;
  local_20 = in_RDX;
  InterchangeObject::InitFromTLVSet(&this->super_InterchangeObject,TLVSet);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Identification_ThisGenerationUID);
    TLVReader::ReadObject(&local_a0,pMVar3,(IArchive *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Identification_CompanyName);
    TLVReader::ReadObject(&local_108,pMVar3,(IArchive *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Identification_ProductName);
    TLVReader::ReadObject(&local_170,pMVar3,(IArchive *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_170);
    Kumu::Result_t::~Result_t((Result_t *)&local_170);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Identification_ProductVersion);
    TLVReader::ReadObject(&local_1d8,pMVar3,(IArchive *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_1d8);
    Kumu::Result_t::~Result_t((Result_t *)&local_1d8);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Identification_VersionString);
    TLVReader::ReadObject(&local_240,pMVar3,(IArchive *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_240);
    Kumu::Result_t::~Result_t((Result_t *)&local_240);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Identification_ProductUID);
    TLVReader::ReadObject(&local_2a8,pMVar3,(IArchive *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_2a8);
    Kumu::Result_t::~Result_t((Result_t *)&local_2a8);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Identification_ModificationDate);
    TLVReader::ReadObject(&local_310,pMVar3,(IArchive *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_310);
    Kumu::Result_t::~Result_t((Result_t *)&local_310);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Identification_ToolkitVersion);
    TLVReader::ReadObject(&local_378,pMVar3,(IArchive *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_378);
    Kumu::Result_t::~Result_t((Result_t *)&local_378);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_Identification_Platform);
    optional_property<ASDCP::MXF::UTF16String>::get
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[5].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    TLVReader::ReadObject(&local_3e0,local_20,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_3e0);
    Kumu::Result_t::~Result_t((Result_t *)&local_3e0);
    has_value = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::UTF16String>::set_has_value
              ((optional_property<ASDCP::MXF::UTF16String> *)
               &TLVSet[5].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count,has_value);
  }
  return this;
}

Assistant:

ASDCP::Result_t
Identification::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Identification, ThisGenerationUID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Identification, CompanyName));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Identification, ProductName));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Identification, ProductVersion));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Identification, VersionString));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Identification, ProductUID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Identification, ModificationDate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(Identification, ToolkitVersion));
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(Identification, Platform));
    Platform.set_has_value( result == RESULT_OK );
  }
  return result;
}